

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_search_facade.c
# Opt level: O0

void do_masked_motion_search_indexed
               (AV1_COMP *cpi,MACROBLOCK *x,int_mv *cur_mv,INTERINTER_COMPOUND_DATA *comp_data,
               BLOCK_SIZE bsize,int_mv *tmp_mv,int *rate_mv,int which)

{
  undefined4 *in_RDX;
  undefined4 *in_R9;
  int in_stack_00000010;
  int joint_me_num_refine_iter;
  int mask_stride;
  uint8_t *mask;
  BLOCK_SIZE sb_type;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  int in_stack_00007fbc;
  uint8_t *in_stack_00007fc0;
  int_mv *in_stack_00007fc8;
  BLOCK_SIZE in_stack_00007fd7;
  MACROBLOCK *in_stack_00007fd8;
  AV1_COMP *in_stack_00007fe0;
  int *in_stack_00007ff0;
  int in_stack_00007ff8;
  int in_stack_0000847c;
  uint8_t *in_stack_00008480;
  int_mv *in_stack_00008488;
  BLOCK_SIZE in_stack_00008497;
  MACROBLOCK *in_stack_00008498;
  AV1_COMP *in_stack_000084a0;
  int *in_stack_000084c0;
  int in_stack_000084c8;
  int in_stack_000084d0;
  INTERINTER_COMPOUND_DATA *in_stack_ffffffffffffff88;
  
  av1_get_compound_type_mask(in_stack_ffffffffffffff88,BLOCK_4X4);
  *in_R9 = *in_RDX;
  in_R9[1] = in_RDX[1];
  if ((in_stack_00000010 == 0) || (in_stack_00000010 == 1)) {
    compound_single_motion_search_interinter
              (in_stack_00007fe0,in_stack_00007fd8,in_stack_00007fd7,in_stack_00007fc8,
               in_stack_00007fc0,in_stack_00007fbc,in_stack_00007ff0,in_stack_00007ff8);
  }
  else if (in_stack_00000010 == 2) {
    av1_joint_motion_search
              (in_stack_000084a0,in_stack_00008498,in_stack_00008497,in_stack_00008488,
               in_stack_00008480,in_stack_0000847c,in_stack_000084c0,in_stack_000084c8,
               in_stack_000084d0);
  }
  return;
}

Assistant:

static inline void do_masked_motion_search_indexed(
    const AV1_COMP *const cpi, MACROBLOCK *x, const int_mv *const cur_mv,
    const INTERINTER_COMPOUND_DATA *const comp_data, BLOCK_SIZE bsize,
    int_mv *tmp_mv, int *rate_mv, int which) {
  // NOTE: which values: 0 - 0 only, 1 - 1 only, 2 - both
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  BLOCK_SIZE sb_type = mbmi->bsize;
  const uint8_t *mask;
  const int mask_stride = block_size_wide[bsize];

  mask = av1_get_compound_type_mask(comp_data, sb_type);

  tmp_mv[0].as_int = cur_mv[0].as_int;
  tmp_mv[1].as_int = cur_mv[1].as_int;
  if (which == 0 || which == 1) {
    compound_single_motion_search_interinter(cpi, x, bsize, tmp_mv, mask,
                                             mask_stride, rate_mv, which);
  } else if (which == 2) {
    const int joint_me_num_refine_iter =
        cpi->sf.inter_sf.enable_fast_compound_mode_search == 2
            ? REDUCED_JOINT_ME_REFINE_ITER
            : NUM_JOINT_ME_REFINE_ITER;
    av1_joint_motion_search(cpi, x, bsize, tmp_mv, mask, mask_stride, rate_mv,
                            !cpi->sf.mv_sf.disable_second_mv,
                            joint_me_num_refine_iter);
  }
}